

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_912cb5::TransformReplace::Transform
          (string *__return_storage_ptr__,TransformReplace *this,string *input)

{
  bool bVar1;
  ostream *poVar2;
  transform_error *this_00;
  string sStack_1b8;
  ostringstream error;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = cmStringReplaceHelper::Replace(&this->ReplaceHelper,input,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar2 = std::operator<<((ostream *)&error,"sub-command TRANSFORM, action REPLACE: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->ReplaceHelper);
  std::operator<<(poVar2,".");
  this_00 = (transform_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  transform_error::transform_error(this_00,&sStack_1b8);
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

std::string Transform(const std::string& input) override
  {
    // Scan through the input for all matches.
    std::string output;

    if (!this->ReplaceHelper.Replace(input, output)) {
      std::ostringstream error;
      error << "sub-command TRANSFORM, action REPLACE: "
            << this->ReplaceHelper.GetError() << ".";
      throw transform_error(error.str());
    }

    return output;
  }